

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

void __thiscall helics::Federate::registerFederate(Federate *this,FederateInfo *fedInfo)

{
  element_type *peVar1;
  _Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
  _Var2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
  local_40;
  Federate *local_38;
  Federate *local_30;
  
  peVar1 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar4 = (*peVar1->_vptr_Core[0x16])
                    (peVar1,(this->mName)._M_string_length,(this->mName)._M_dataplus._M_p,fedInfo);
  (this->fedID).fid = iVar4;
  sVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &this->mName,"${",0);
  if (sVar5 != 0xffffffffffffffff) {
    peVar1 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar4 = (*peVar1->_vptr_Core[0x17])(peVar1,(ulong)(uint)(this->fedID).fid);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->mName,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(extraout_var,iVar4));
  }
  this->nameSegmentSeparator = fedInfo->separator;
  bVar3 = FederateInfo::checkFlagProperty(fedInfo,0x4b,true);
  this->strictConfigChecking = bVar3;
  this->useJsonSerialization = fedInfo->useJsonSerialization;
  this->observerMode = fedInfo->observer;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->configFile,
             &fedInfo->configString);
  peVar1 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar4 = (*peVar1->_vptr_Core[0x21])(peVar1,(ulong)(uint)(this->fedID).fid);
  (this->mCurrentTime).internalTimeCode = CONCAT44(extraout_var_00,iVar4);
  if (this->singleThreadFederate == false) {
    std::make_unique<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,std::mutex>>();
    _Var2._M_head_impl = local_40._M_head_impl;
    local_40._M_head_impl = (shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *)0x0;
    std::
    __uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
    ::reset((__uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
             *)&this->asyncCallInfo,_Var2._M_head_impl);
    std::
    unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
    ::~unique_ptr((unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                   *)&local_40);
  }
  local_30 = (Federate *)
             (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38 = this;
  std::
  make_unique<helics::ConnectorFederateManager,helics::Core*,helics::Federate*,helics::LocalFederateId&,bool&>
            ((Core **)&local_40,&local_30,(LocalFederateId *)&local_38,(bool *)&this->fedID);
  _Var2._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *)0x0;
  std::
  __uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
  ::reset((__uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
           *)&this->cManager,(pointer)_Var2._M_head_impl);
  std::
  unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
  ::~unique_ptr((unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
                 *)&local_40);
  if ((this->configFile)._M_string_length != 0) {
    registerConnectorInterfaces(this,&this->configFile);
  }
  return;
}

Assistant:

void Federate::registerFederate(const FederateInfo& fedInfo)
{
    // this call will throw an error on failure
    fedID = coreObject->registerFederate(mName, fedInfo);
    if (mName.find("${") != std::string::npos) {
        mName = coreObject->getFederateName(fedID);
    }

    nameSegmentSeparator = fedInfo.separator;
    strictConfigChecking = fedInfo.checkFlagProperty(defs::Flags::STRICT_CONFIG_CHECKING, true);

    useJsonSerialization = fedInfo.useJsonSerialization;
    observerMode = fedInfo.observer;
    configFile = fedInfo.configString;
    mCurrentTime = coreObject->getCurrentTime(fedID);
    if (!singleThreadFederate) {
        asyncCallInfo = std::make_unique<shared_guarded_m<AsyncFedCallInfo>>();
    }
    cManager = std::make_unique<ConnectorFederateManager>(coreObject.get(),
                                                          this,
                                                          fedID,
                                                          singleThreadFederate);
    if (!configFile.empty()) {
        registerConnectorInterfaces(configFile);
    }
}